

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_slice_header(h264_stream_t *h,bs_t *b)

{
  slice_header_t *__s;
  nal_t *pnVar1;
  byte *pbVar2;
  sps_t *psVar3;
  pps_t *__dest;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32_t r;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  FILE *pFVar12;
  bool bVar13;
  
  __s = h->sh;
  iVar8 = 0;
  memset(__s,0,0x1b80);
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  pnVar1 = h->nal;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar10 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar13 = true;
    if (pbVar4 < pbVar2) {
      bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar8 == -1) {
    uVar10 = 0;
  }
  else {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  uVar5 = 0xffffffff;
  __s->first_mb_in_slice = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  iVar8 = 0;
  fprintf(pFVar12,"sh->first_mb_in_slice: %d \n");
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar10 = b->bits_left;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar13 = true;
    if (pbVar4 < pbVar2) {
      bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar8 == -1) {
    uVar10 = 0;
  }
  else {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  uVar5 = 0xffffffff;
  __s->slice_type = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  iVar8 = 0;
  fprintf(pFVar12,"sh->slice_type: %d \n");
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar10 = b->bits_left;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar13 = true;
    if (pbVar4 < pbVar2) {
      bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar8 == -1) {
    uVar10 = 0;
  }
  else {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  __s->pic_parameter_set_id = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->pic_parameter_set_id: %d \n");
  psVar3 = h->sps;
  __dest = h->pps;
  memcpy(__dest,h->pps_table[__s->pic_parameter_set_id],0x87c);
  memcpy(h->sps,h->sps_table[__dest->seq_parameter_set_id],0x1028);
  if (psVar3->residual_colour_transform_flag != 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar5 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    uVar10 = b->bits_left;
    iVar8 = 1;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar7 = 0;
      if (pbVar4 < b->end) {
        uVar7 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar5 = uVar5 | uVar7 << ((byte)iVar8 & 0x1f);
      bVar13 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar13);
    __s->colour_plane_id = uVar5;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->colour_plane_id: %d \n",(ulong)uVar5);
  }
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  uVar9 = 0;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  if (-4 < psVar3->log2_max_frame_num_minus4) {
    pbVar4 = b->p;
    uVar10 = b->bits_left;
    iVar8 = psVar3->log2_max_frame_num_minus4 + 3;
    uVar9 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar5 = 0;
      if (pbVar4 < b->end) {
        uVar5 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar9 = (ulong)((uint)uVar9 | uVar5 << ((byte)iVar8 & 0x1f));
      bVar13 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar13);
  }
  __s->frame_num = (int)uVar9;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->frame_num: %d \n",uVar9);
  if (psVar3->frame_mbs_only_flag == 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar10 = b->bits_left - 1;
    b->bits_left = uVar10;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar9 = (ulong)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    __s->field_pic_flag = (int)uVar9;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->field_pic_flag: %d \n",uVar9);
    if (__s->field_pic_flag != 0) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      uVar9 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar10 = b->bits_left - 1;
      b->bits_left = uVar10;
      pbVar4 = b->p;
      if (pbVar4 < b->end) {
        uVar9 = (ulong)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        b->p = pbVar4 + 1;
        b->bits_left = 8;
      }
      __s->bottom_field_flag = (int)uVar9;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->bottom_field_flag: %d \n",uVar9);
    }
  }
  if (pnVar1->nal_unit_type == 5) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar8 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar2 = b->end;
    uVar10 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar13 = true;
      if (pbVar4 < pbVar2) {
        bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar8 = iVar8 + -1;
    } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
    if (iVar8 == -1) {
      uVar10 = 0;
    }
    else {
      iVar6 = -2 - iVar8;
      iVar11 = -3 - iVar8;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar10 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < pbVar2) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    __s->idr_pic_id = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->idr_pic_id: %d \n");
  }
  if (psVar3->pic_order_cnt_type == 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    if (-4 < psVar3->log2_max_pic_order_cnt_lsb_minus4) {
      pbVar4 = b->p;
      uVar10 = b->bits_left;
      iVar8 = psVar3->log2_max_pic_order_cnt_lsb_minus4 + 3;
      uVar9 = 0;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        uVar5 = 0;
        if (pbVar4 < b->end) {
          uVar5 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar9 = (ulong)((uint)uVar9 | uVar5 << ((byte)iVar8 & 0x1f));
        bVar13 = iVar8 != 0;
        iVar8 = iVar8 + -1;
      } while (bVar13);
    }
    __s->pic_order_cnt_lsb = (int)uVar9;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->pic_order_cnt_lsb: %d \n",uVar9);
    if ((__dest->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar10 = b->bits_left;
      uVar5 = 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar5 = uVar5 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      uVar7 = -1 << (~(byte)iVar8 & 0x1f);
      uVar5 = ~uVar7 + uVar10;
      iVar8 = -((int)uVar5 >> 1);
      if ((uVar5 & 1) != 0) {
        iVar8 = (int)(uVar10 - uVar7) >> 1;
      }
      __s->delta_pic_order_cnt_bottom = iVar8;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->delta_pic_order_cnt_bottom: %d \n");
    }
  }
  if ((psVar3->pic_order_cnt_type == 1) && (psVar3->delta_pic_order_always_zero_flag == 0)) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar8 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar2 = b->end;
    uVar10 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar13 = true;
      if (pbVar4 < pbVar2) {
        bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar8 = iVar8 + -1;
    } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
    if (iVar8 == -1) {
      uVar10 = 0;
    }
    else {
      iVar6 = -2 - iVar8;
      iVar11 = -3 - iVar8;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar10 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < pbVar2) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    uVar7 = -1 << (~(byte)iVar8 & 0x1f);
    uVar5 = ~uVar7 + uVar10;
    iVar8 = -((int)uVar5 >> 1);
    if ((uVar5 & 1) != 0) {
      iVar8 = (int)(uVar10 - uVar7) >> 1;
    }
    __s->delta_pic_order_cnt[0] = iVar8;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->delta_pic_order_cnt[ 0 ]: %d \n");
    if ((__dest->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar10 = b->bits_left;
      uVar5 = 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar5 = uVar5 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      uVar7 = -1 << (~(byte)iVar8 & 0x1f);
      uVar5 = ~uVar7 + uVar10;
      iVar8 = -((int)uVar5 >> 1);
      if ((uVar5 & 1) != 0) {
        iVar8 = (int)(uVar10 - uVar7) >> 1;
      }
      __s->delta_pic_order_cnt[1] = iVar8;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->delta_pic_order_cnt[ 1 ]: %d \n");
    }
  }
  if (__dest->redundant_pic_cnt_present_flag != 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar8 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar2 = b->end;
    uVar10 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar13 = true;
      if (pbVar4 < pbVar2) {
        bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar8 = iVar8 + -1;
    } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
    if (iVar8 == -1) {
      uVar10 = 0;
    }
    else {
      iVar6 = -2 - iVar8;
      iVar11 = -3 - iVar8;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar10 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < pbVar2) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    __s->redundant_pic_cnt = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->redundant_pic_cnt: %d \n");
  }
  iVar8 = __s->slice_type;
  iVar6 = iVar8 + -5;
  if (iVar8 < 5) {
    iVar6 = iVar8;
  }
  if (iVar6 == 1) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar10 = b->bits_left - 1;
    b->bits_left = uVar10;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar9 = (ulong)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    __s->direct_spatial_mv_pred_flag = (int)uVar9;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->direct_spatial_mv_pred_flag: %d \n",uVar9);
  }
  uVar10 = __s->slice_type;
  uVar5 = uVar10 - 5;
  if ((int)uVar10 < 5) {
    uVar5 = uVar10;
  }
  if ((uVar5 < 4) && (uVar5 != 2)) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar10 = b->bits_left - 1;
    b->bits_left = uVar10;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar9 = (ulong)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    __s->num_ref_idx_active_override_flag = (int)uVar9;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->num_ref_idx_active_override_flag: %d \n",uVar9);
    if (__s->num_ref_idx_active_override_flag != 0) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar10 = b->bits_left;
      uVar5 = 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar5 = uVar5 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      __s->num_ref_idx_l0_active_minus1 = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->num_ref_idx_l0_active_minus1: %d \n");
      iVar8 = __s->slice_type;
      iVar6 = iVar8 + -5;
      if (iVar8 < 5) {
        iVar6 = iVar8;
      }
      if (iVar6 == 1) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        iVar8 = 0;
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar4 = b->p;
        pbVar2 = b->end;
        uVar10 = b->bits_left;
        uVar5 = 0xffffffff;
        do {
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar13 = true;
          if (pbVar4 < pbVar2) {
            bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar5 = uVar5 + 1;
          iVar8 = iVar8 + -1;
        } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
        if (iVar8 == -1) {
          uVar10 = 0;
        }
        else {
          iVar6 = -2 - iVar8;
          iVar11 = -3 - iVar8;
          uVar5 = b->bits_left;
          pbVar4 = b->p;
          uVar10 = 0;
          do {
            uVar5 = uVar5 - 1;
            b->bits_left = uVar5;
            uVar7 = 0;
            if (pbVar4 < pbVar2) {
              uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
            }
            if (uVar5 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar5 = 8;
            }
            uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
            iVar11 = iVar11 + -1;
            iVar6 = iVar6 + -1;
          } while (iVar11 != -2);
        }
        __s->num_ref_idx_l1_active_minus1 = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->num_ref_idx_l1_active_minus1: %d \n");
      }
    }
  }
  read_debug_ref_pic_list_reordering(h,b);
  if (__dest->weighted_pred_flag == 0) {
LAB_00139b38:
    if (__dest->weighted_bipred_idc == 1) {
      iVar8 = __s->slice_type;
      iVar6 = iVar8 + -5;
      if (iVar8 < 5) {
        iVar6 = iVar8;
      }
      if (iVar6 == 1) goto LAB_00139b53;
    }
  }
  else {
    iVar8 = __s->slice_type;
    iVar6 = iVar8 + -5;
    if (iVar8 < 5) {
      iVar6 = iVar8;
    }
    if ((iVar6 != 0) && (iVar6 != 3)) goto LAB_00139b38;
LAB_00139b53:
    read_debug_pred_weight_table(h,b);
  }
  if (pnVar1->nal_ref_idc != 0) {
    read_debug_dec_ref_pic_marking(h,b);
  }
  if (__dest->entropy_coding_mode_flag != 0) {
    iVar8 = __s->slice_type;
    iVar6 = iVar8 + -5;
    if (iVar8 < 5) {
      iVar6 = iVar8;
    }
    if ((iVar6 != 2) && (iVar6 != 4)) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar10 = b->bits_left;
      uVar5 = 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar5 = uVar5 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      __s->cabac_init_idc = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->cabac_init_idc: %d \n");
    }
  }
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  iVar8 = 0;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar10 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar13 = true;
    if (pbVar4 < pbVar2) {
      bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar8 == -1) {
    uVar10 = 0;
  }
  else {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  uVar7 = -1 << (~(byte)iVar8 & 0x1f);
  uVar5 = ~uVar7 + uVar10;
  iVar8 = -((int)uVar5 >> 1);
  if ((uVar5 & 1) != 0) {
    iVar8 = (int)(uVar10 - uVar7) >> 1;
  }
  __s->slice_qp_delta = iVar8;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->slice_qp_delta: %d \n");
  iVar8 = __s->slice_type;
  iVar6 = iVar8 + -5;
  if (iVar8 < 5) {
    iVar6 = iVar8;
  }
  if (iVar6 != 4) {
    if (iVar6 != 3) goto LAB_00139fc3;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    uVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar10 = b->bits_left - 1;
    b->bits_left = uVar10;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      uVar9 = (ulong)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      b->p = pbVar4 + 1;
      b->bits_left = 8;
    }
    __s->sp_for_switch_flag = (int)uVar9;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->sp_for_switch_flag: %d \n",uVar9);
  }
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  iVar8 = 0;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar10 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar13 = true;
    if (pbVar4 < pbVar2) {
      bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  if (iVar8 == -1) {
    uVar10 = 0;
  }
  else {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar5 = b->bits_left;
    pbVar4 = b->p;
    uVar10 = 0;
    do {
      uVar5 = uVar5 - 1;
      b->bits_left = uVar5;
      uVar7 = 0;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  uVar7 = -1 << (~(byte)iVar8 & 0x1f);
  uVar5 = ~uVar7 + uVar10;
  iVar8 = -((int)uVar5 >> 1);
  if ((uVar5 & 1) != 0) {
    iVar8 = (int)(uVar10 - uVar7) >> 1;
  }
  __s->slice_qs_delta = iVar8;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->slice_qs_delta: %d \n");
LAB_00139fc3:
  if (__dest->deblocking_filter_control_present_flag != 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar8 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar4 = b->p;
    pbVar2 = b->end;
    uVar10 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar13 = true;
      if (pbVar4 < pbVar2) {
        bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar8 = iVar8 + -1;
    } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
    if (iVar8 == -1) {
      uVar10 = 0;
    }
    else {
      iVar6 = -2 - iVar8;
      iVar11 = -3 - iVar8;
      uVar5 = b->bits_left;
      pbVar4 = b->p;
      uVar10 = 0;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < pbVar2) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar11 != -2);
    }
    __s->disable_deblocking_filter_idc = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar10;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->disable_deblocking_filter_idc: %d \n");
    if (__s->disable_deblocking_filter_idc != 1) {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar10 = b->bits_left;
      uVar5 = 0xffffffff;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar5 = uVar5 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      uVar7 = -1 << (~(byte)iVar8 & 0x1f);
      uVar5 = ~uVar7 + uVar10;
      iVar8 = -((int)uVar5 >> 1);
      if ((uVar5 & 1) != 0) {
        iVar8 = (int)(uVar10 - uVar7) >> 1;
      }
      uVar10 = 0xffffffff;
      __s->slice_alpha_c0_offset_div2 = iVar8;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      iVar8 = 0;
      fprintf(pFVar12,"sh->slice_alpha_c0_offset_div2: %d \n");
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar4 = b->p;
      pbVar2 = b->end;
      uVar5 = b->bits_left;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        bVar13 = true;
        if (pbVar4 < pbVar2) {
          bVar13 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 + 1;
        iVar8 = iVar8 + -1;
      } while (((bool)(bVar13 & uVar10 < 0x20)) && (pbVar4 < pbVar2));
      if (iVar8 == -1) {
        uVar10 = 0;
      }
      else {
        iVar6 = -2 - iVar8;
        iVar11 = -3 - iVar8;
        uVar5 = b->bits_left;
        pbVar4 = b->p;
        uVar10 = 0;
        do {
          uVar5 = uVar5 - 1;
          b->bits_left = uVar5;
          uVar7 = 0;
          if (pbVar4 < pbVar2) {
            uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar5 = 8;
          }
          uVar10 = uVar10 | uVar7 << ((byte)iVar6 & 0x1f);
          iVar11 = iVar11 + -1;
          iVar6 = iVar6 + -1;
        } while (iVar11 != -2);
      }
      uVar7 = -1 << (~(byte)iVar8 & 0x1f);
      uVar5 = ~uVar7 + uVar10;
      iVar8 = -((int)uVar5 >> 1);
      if ((uVar5 & 1) != 0) {
        iVar8 = (int)(uVar10 - uVar7) >> 1;
      }
      __s->slice_beta_offset_div2 = iVar8;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->slice_beta_offset_div2: %d \n");
    }
  }
  if ((0 < __dest->num_slice_groups_minus1) && (__dest->slice_group_map_type - 3U < 3)) {
    iVar8 = __dest->slice_group_change_rate_minus1 + __dest->pic_size_in_map_units_minus1;
    if (iVar8 < 0) {
      iVar8 = -1;
    }
    iVar6 = -1;
    do {
      iVar11 = iVar6;
      iVar6 = iVar11 + 1;
    } while (iVar8 + 1U >> ((byte)iVar6 & 0x1f) != 0);
    if (iVar8 + 1U != 1 << ((byte)iVar11 & 0x1f)) {
      iVar11 = iVar6;
    }
    uVar10 = 0;
    if (iVar6 == 0) {
      iVar11 = 0;
    }
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    if (0 < iVar11) {
      pbVar4 = b->p;
      uVar5 = b->bits_left;
      do {
        iVar11 = iVar11 + -1;
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar7 = 0;
        if (pbVar4 < b->end) {
          uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar10 = uVar10 | uVar7 << ((byte)iVar11 & 0x1f);
      } while (iVar11 != 0);
    }
    __s->slice_group_change_cycle = uVar10;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->slice_group_change_cycle: %d \n",(ulong)uVar10);
    return;
  }
  return;
}

Assistant:

void read_debug_slice_header(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    if( 1 )
    {
        memset(sh, 0, sizeof(slice_header_t));
    }

    nal_t* nal = h->nal;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->first_mb_in_slice = bs_read_ue(b); printf("sh->first_mb_in_slice: %d \n", sh->first_mb_in_slice); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_type = bs_read_ue(b); printf("sh->slice_type: %d \n", sh->slice_type); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_parameter_set_id = bs_read_ue(b); printf("sh->pic_parameter_set_id: %d \n", sh->pic_parameter_set_id); 

    // TODO check existence, otherwise fail
    pps_t* pps = h->pps;
    sps_t* sps = h->sps;
    memcpy(h->pps, h->pps_table[sh->pic_parameter_set_id], sizeof(pps_t));
    memcpy(h->sps, h->sps_table[pps->seq_parameter_set_id], sizeof(sps_t));

    if (sps->residual_colour_transform_flag)
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->colour_plane_id = bs_read_u(b, 2); printf("sh->colour_plane_id: %d \n", sh->colour_plane_id); 
    }

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->frame_num = bs_read_u(b, sps->log2_max_frame_num_minus4 + 4 ); printf("sh->frame_num: %d \n", sh->frame_num);  // was u(v)
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->field_pic_flag = bs_read_u1(b); printf("sh->field_pic_flag: %d \n", sh->field_pic_flag); 
        if( sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->bottom_field_flag = bs_read_u1(b); printf("sh->bottom_field_flag: %d \n", sh->bottom_field_flag); 
        }
    }
    if( nal->nal_unit_type == 5 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->idr_pic_id = bs_read_ue(b); printf("sh->idr_pic_id: %d \n", sh->idr_pic_id); 
    }
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_order_cnt_lsb = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4 ); printf("sh->pic_order_cnt_lsb: %d \n", sh->pic_order_cnt_lsb);  // was u(v)
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt_bottom = bs_read_se(b); printf("sh->delta_pic_order_cnt_bottom: %d \n", sh->delta_pic_order_cnt_bottom); 
        }
    }
    if( sps->pic_order_cnt_type == 1 && !sps->delta_pic_order_always_zero_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 0 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 0 ]: %d \n", sh->delta_pic_order_cnt[ 0 ]); 
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 1 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 1 ]: %d \n", sh->delta_pic_order_cnt[ 1 ]); 
        }
    }
    if( pps->redundant_pic_cnt_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->redundant_pic_cnt = bs_read_ue(b); printf("sh->redundant_pic_cnt: %d \n", sh->redundant_pic_cnt); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->direct_spatial_mv_pred_flag = bs_read_u1(b); printf("sh->direct_spatial_mv_pred_flag: %d \n", sh->direct_spatial_mv_pred_flag); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_active_override_flag = bs_read_u1(b); printf("sh->num_ref_idx_active_override_flag: %d \n", sh->num_ref_idx_active_override_flag); 
        if( sh->num_ref_idx_active_override_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l0_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l0_active_minus1: %d \n", sh->num_ref_idx_l0_active_minus1);  // FIXME does this modify the pps?
            if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l1_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l1_active_minus1: %d \n", sh->num_ref_idx_l1_active_minus1); 
            }
        }
    }
    read_debug_ref_pic_list_reordering(h, b);
    if( ( pps->weighted_pred_flag && ( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) ) ) ||
        ( pps->weighted_bipred_idc == 1 && is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) ) )
    {
        read_debug_pred_weight_table(h, b);
    }
    if( nal->nal_ref_idc != 0 )
    {
        read_debug_dec_ref_pic_marking(h, b);
    }
    if( pps->entropy_coding_mode_flag && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->cabac_init_idc = bs_read_ue(b); printf("sh->cabac_init_idc: %d \n", sh->cabac_init_idc); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qp_delta = bs_read_se(b); printf("sh->slice_qp_delta: %d \n", sh->slice_qp_delta); 
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->sp_for_switch_flag = bs_read_u1(b); printf("sh->sp_for_switch_flag: %d \n", sh->sp_for_switch_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qs_delta = bs_read_se(b); printf("sh->slice_qs_delta: %d \n", sh->slice_qs_delta); 
    }
    if( pps->deblocking_filter_control_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->disable_deblocking_filter_idc = bs_read_ue(b); printf("sh->disable_deblocking_filter_idc: %d \n", sh->disable_deblocking_filter_idc); 
        if( sh->disable_deblocking_filter_idc != 1 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_alpha_c0_offset_div2 = bs_read_se(b); printf("sh->slice_alpha_c0_offset_div2: %d \n", sh->slice_alpha_c0_offset_div2); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_beta_offset_div2 = bs_read_se(b); printf("sh->slice_beta_offset_div2: %d \n", sh->slice_beta_offset_div2); 
        }
    }
    if( pps->num_slice_groups_minus1 > 0 &&
        pps->slice_group_map_type >= 3 && pps->slice_group_map_type <= 5)
    {
        int v = intlog2( pps->pic_size_in_map_units_minus1 +  pps->slice_group_change_rate_minus1 + 1 );
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_group_change_cycle = bs_read_u(b, v); printf("sh->slice_group_change_cycle: %d \n", sh->slice_group_change_cycle);  // FIXME add 2?
    }
}